

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O1

aiMeshMorphAnim * CreateMeshMorphAnim(Asset *r,Node *node,AnimationSamplers *samplers)

{
  undefined8 *puVar1;
  uint uVar2;
  Sampler *pSVar3;
  ulong uVar4;
  aiMeshMorphAnim *paVar5;
  ulong *puVar6;
  void *pvVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  aiMeshMorphKey *paVar13;
  long lVar14;
  float *values;
  float *times;
  float *local_68;
  ulong local_60;
  ulong local_58;
  float *local_50;
  ulong local_48;
  long local_40 [2];
  
  paVar5 = (aiMeshMorphAnim *)operator_new(0x410);
  (paVar5->mName).length = 0;
  (paVar5->mName).data[0] = '\0';
  memset((paVar5->mName).data + 1,0x1b,0x3ff);
  paVar5->mNumKeys = 0;
  paVar5->mKeys = (aiMeshMorphKey *)0x0;
  uVar4 = (ulong)((node->super_Object).name._M_string_length != 0);
  lVar10 = *(long *)((node->matrix).value + uVar4 * 8 + -0x1c);
  local_50 = (float *)local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,lVar10,*(long *)((node->matrix).value + uVar4 * 8 + -0x1a) + lVar10
            );
  if (local_48 < 0x400) {
    (paVar5->mName).length = (ai_uint32)local_48;
    memcpy((paVar5->mName).data,local_50,local_48);
    (paVar5->mName).data[local_48] = '\0';
  }
  if (local_50 != (float *)local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  pSVar3 = samplers->weight;
  if (pSVar3 != (Sampler *)0x0) {
    lVar10 = 0;
    local_50 = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              ((((pSVar3->input).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(pSVar3->input).index],&local_50);
    local_68 = (float *)0x0;
    glTF2::Accessor::ExtractData<float>
              ((((samplers->weight->output).vector)->
               super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[(samplers->weight->output).index],&local_68);
    pSVar3 = samplers->weight;
    uVar4 = (((pSVar3->input).vector)->
            super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl.
            super__Vector_impl_data._M_start[(pSVar3->input).index]->count;
    uVar8 = (uint)uVar4;
    paVar5->mNumKeys = uVar8;
    uVar2 = (uint)(((pSVar3->output).vector)->
                  super__Vector_base<glTF2::Accessor_*,_std::allocator<glTF2::Accessor_*>_>)._M_impl
                  .super__Vector_impl_data._M_start[(pSVar3->output).index]->count;
    lVar14 = (uVar4 & 0xffffffff) * 0x20;
    puVar6 = (ulong *)operator_new__(lVar14 + 8);
    *puVar6 = uVar4 & 0xffffffff;
    paVar13 = (aiMeshMorphKey *)(puVar6 + 1);
    do {
      puVar1 = (undefined8 *)((long)puVar6 + lVar10 + 0x14);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&paVar13->mTime + lVar10);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar10 = lVar10 + 0x20;
    } while (lVar14 != lVar10);
    uVar12 = 0;
    uVar4 = (ulong)uVar2 / (uVar4 & 0xffffffff);
    paVar5->mKeys = paVar13;
    local_58 = uVar4 * 4;
    local_60 = uVar4 * 8;
    iVar11 = 0;
    do {
      paVar13[uVar12].mTime = (double)(local_50[uVar12] * 1000.0);
      *(int *)(puVar6 + uVar12 * 4 + 4) = (int)uVar4;
      pvVar7 = operator_new__(local_58);
      puVar6[uVar12 * 4 + 2] = (ulong)pvVar7;
      pvVar7 = operator_new__(local_60);
      puVar6[uVar12 * 4 + 3] = (ulong)pvVar7;
      if (uVar8 <= uVar2) {
        uVar9 = 0;
        do {
          paVar13[uVar12].mValues[uVar9] = (uint)uVar9;
          paVar13[uVar12].mWeights[uVar9] =
               (double)(float)(~-(uint)(local_68[iVar11 + (uint)uVar9] <= 0.0) &
                              (uint)local_68[iVar11 + (uint)uVar9]);
          uVar9 = uVar9 + 1;
        } while (uVar9 < uVar4);
        iVar11 = iVar11 + (int)uVar9;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar8 + (uVar8 == 0));
    if (local_50 != (float *)0x0) {
      operator_delete__(local_50);
    }
    if (local_68 != (float *)0x0) {
      operator_delete__(local_68);
    }
  }
  return paVar5;
}

Assistant:

aiMeshMorphAnim *CreateMeshMorphAnim(glTF2::Asset &r, Node &node, AnimationSamplers &samplers) {
	aiMeshMorphAnim *anim = new aiMeshMorphAnim();
	anim->mName = GetNodeName(node);

	static const float kMillisecondsFromSeconds = 1000.f;

	if (nullptr != samplers.weight) {
		float *times = nullptr;
		samplers.weight->input->ExtractData(times);
		float *values = nullptr;
		samplers.weight->output->ExtractData(values);
		anim->mNumKeys = static_cast<uint32_t>(samplers.weight->input->count);

		const unsigned int numMorphs = (unsigned int)samplers.weight->output->count / anim->mNumKeys;

		anim->mKeys = new aiMeshMorphKey[anim->mNumKeys];
		unsigned int k = 0u;
		for (unsigned int i = 0u; i < anim->mNumKeys; ++i) {
			anim->mKeys[i].mTime = times[i] * kMillisecondsFromSeconds;
			anim->mKeys[i].mNumValuesAndWeights = numMorphs;
			anim->mKeys[i].mValues = new unsigned int[numMorphs];
			anim->mKeys[i].mWeights = new double[numMorphs];

			for (unsigned int j = 0u; j < numMorphs; ++j, ++k) {
				anim->mKeys[i].mValues[j] = j;
				anim->mKeys[i].mWeights[j] = (0.f > values[k]) ? 0.f : values[k];
			}
		}

		delete[] times;
		delete[] values;
	}

	return anim;
}